

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int ParseEXRHeaderFromFile(EXRHeader *exr_header,EXRVersion *exr_version,char *filename,char **err)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  size_type __n;
  size_t sVar3;
  undefined8 uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if ((exr_version == (EXRVersion *)0x0 || exr_header == (EXRHeader *)0x0) ||
      filename == (char *)0x0) {
    iVar1 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar2 = "Invalid argument.";
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,__n,&local_49);
      sVar3 = fread(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,1,__n,__stream);
      fclose(__stream);
      if (sVar3 == __n) {
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar4 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
          if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (uchar *)0x0) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar4);
        }
        iVar1 = ParseEXRHeaderFromMemory
                          (exr_header,exr_version,
                           local_48.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,err);
      }
      else {
        iVar1 = -5;
        if (err != (char **)0x0) {
          *err = "fread error.";
        }
      }
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (uchar *)0x0) {
        return iVar1;
      }
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      return iVar1;
    }
    iVar1 = -6;
    if (err == (char **)0x0) {
      return -6;
    }
    pcVar2 = "Cannot read file.";
  }
  *err = pcVar2;
  return iVar1;
}

Assistant:

int ParseEXRHeaderFromFile(EXRHeader *exr_header, const EXRVersion *exr_version,
                           const char *filename, const char **err) {
  if (exr_header == NULL || exr_version == NULL || filename == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      if (err) {
        (*err) = "fread error.";
      }
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRHeaderFromMemory(exr_header, exr_version, &buf.at(0), err);
}